

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

cTValue * lj_meta_lookup(lua_State *L,cTValue *o,MMS mm)

{
  uint uVar1;
  uint in_EDX;
  uint *in_RSI;
  long in_RDI;
  cTValue *mo;
  GCtab *mt;
  uint local_40;
  uint local_3c;
  GCtab *local_28;
  cTValue *local_8;
  
  if (in_RSI[1] == 0xfffffff4) {
    uVar1 = *(uint *)((ulong)*in_RSI + 0x10);
  }
  else if (in_RSI[1] == 0xfffffff3) {
    uVar1 = *(uint *)((ulong)*in_RSI + 0x10);
  }
  else {
    if (in_RSI[1] < 0xffff0000) {
      local_3c = 0xd;
    }
    else {
      if ((int)in_RSI[1] >> 0xf == -2) {
        local_40 = 3;
      }
      else {
        local_40 = in_RSI[1] ^ 0xffffffff;
      }
      local_3c = local_40;
    }
    uVar1 = *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x100 + (ulong)(local_3c + 0x16) * 4);
  }
  local_28 = (GCtab *)(ulong)uVar1;
  if ((local_28 == (GCtab *)0x0) ||
     (local_8 = lj_tab_getstr(local_28,(GCstr *)(ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) +
                                                                 0x100 + (ulong)in_EDX * 4)),
     local_8 == (cTValue *)0x0)) {
    local_8 = (cTValue *)((ulong)*(uint *)(in_RDI + 8) + 0x68);
  }
  return local_8;
}

Assistant:

cTValue *lj_meta_lookup(lua_State *L, cTValue *o, MMS mm)
{
  GCtab *mt;
  if (tvistab(o))
    mt = tabref(tabV(o)->metatable);
  else if (tvisudata(o))
    mt = tabref(udataV(o)->metatable);
  else
    mt = tabref(basemt_obj(G(L), o));
  if (mt) {
    cTValue *mo = lj_tab_getstr(mt, mmname_str(G(L), mm));
    if (mo)
      return mo;
  }
  return niltv(L);
}